

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CHARACTER::GarbageCollector
          (_Type_CHARACTER *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  Character *pCVar2;
  Variable *this_00;
  long in_RCX;
  long *plVar3;
  code *local_78;
  code *local_58;
  Character *C;
  offset_in_Memory_to_subr caller_local;
  Variable *object_local;
  _Type_CHARACTER *this_local;
  
  pOVar1 = Variable::operator->(object);
  plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + in_RCX);
  local_58 = (code *)caller;
  if ((caller & 1) != 0) {
    local_58 = *(code **)(*plVar3 + (caller - 1));
  }
  pOVar1 = Variable::operator->(object);
  (*local_58)(plVar3,pOVar1->ID);
  pOVar1 = Variable::operator->(object);
  pCVar2 = Object::GetData<LiteScript::Character>(pOVar1);
  if ((*(pCVar2->obj_string).isNull & 1U) == 0) {
    pOVar1 = Variable::operator->(object);
    plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + in_RCX);
    local_78 = (code *)caller;
    if ((caller & 1) != 0) {
      local_78 = *(code **)(*plVar3 + (caller - 1));
    }
    this_00 = Nullable<LiteScript::Variable>::operator*(&pCVar2->obj_string);
    pOVar1 = Variable::operator->(this_00);
    (*local_78)(plVar3,pOVar1->ID);
  }
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    (object->memory.*caller)(object->ID);
    const Character& C = object->GetData<Character>();
    if (!C.obj_string.isNull)
        (object->memory.*caller)((*C.obj_string)->ID);
}